

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  short sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  uint uVar42;
  int iVar43;
  stbi__jpeg *psVar44;
  byte *pbVar45;
  byte *pbVar46;
  stbi__context *psVar47;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar48;
  void *pvVar49;
  code *pcVar50;
  stbi__context *psVar51;
  uchar *puVar52;
  stbi_uc *psVar53;
  long lVar54;
  long lVar55;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar56;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar57;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong uVar58;
  stbi_uc *psVar59;
  stbi_uc *psVar60;
  int iVar61;
  stbi__uint32 sVar62;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  short *psVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  ulong uVar68;
  int *piVar69;
  ulong uVar70;
  ulong uVar71;
  int iVar72;
  uint uVar73;
  stbi_uc (*pasVar74) [4];
  bool bVar75;
  undefined1 auVar76 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8970;
  uint local_8944;
  int local_8934;
  uint local_8930;
  int local_8904;
  uint local_88ec;
  stbi__bmp_data local_88e8;
  ulong local_88c8;
  undefined4 local_88c0;
  uint local_88bc;
  undefined8 local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar60 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar38 = stbi__get_marker(psVar44);
  if (sVar38 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar38 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar44->img_comp[0].raw_data = (void *)0x0;
      psVar44->img_comp[0].raw_coeff = (void *)0x0;
      psVar44->img_comp[1].raw_data = (void *)0x0;
      psVar44->img_comp[1].raw_coeff = (void *)0x0;
      psVar44->img_comp[2].raw_data = (void *)0x0;
      psVar44->img_comp[2].raw_coeff = (void *)0x0;
      psVar44->img_comp[3].raw_data = (void *)0x0;
      psVar44->img_comp[3].raw_coeff = (void *)0x0;
      psVar44->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar44,0);
      uVar73 = extraout_EDX;
      if (iVar40 != 0) {
        paVar1 = psVar44->img_comp;
        bVar39 = stbi__get_marker(psVar44);
LAB_001488e1:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar44->s);
          psVar51 = psVar44->s;
          pbVar46 = psVar51->img_buffer;
          paVar57 = extraout_RDX_00;
          if (psVar51->img_buffer_end <= pbVar46) {
            if (psVar51->read_from_callbacks != 0) {
              psVar60 = psVar51->buffer_start;
              iVar67 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
              if (iVar67 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar59 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                bVar39 = 0;
              }
              else {
                psVar59 = psVar60 + iVar67;
                bVar39 = *psVar60;
              }
              psVar51->img_buffer_end = psVar59;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              paVar57 = extraout_RDX_01;
              goto LAB_001489d0;
            }
            psVar44->scan_n = 0;
LAB_0014a551:
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_0014a558;
          }
          psVar51->img_buffer = pbVar46 + 1;
          bVar39 = *pbVar46;
LAB_001489d0:
          uVar73 = (uint)bVar39;
          psVar44->scan_n = uVar73;
          if (((byte)(bVar39 - 5) < 0xfc) || (psVar51 = psVar44->s, psVar51->img_n < (int)uVar73))
          goto LAB_0014a551;
          if (iVar40 != uVar73 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_0014a558;
          }
          lVar55 = 0;
          do {
            pbVar45 = psVar51->img_buffer;
            pbVar46 = psVar51->img_buffer_end;
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar66 = (uint)*pbVar45;
              pbVar45 = pbVar45 + 1;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar66 = 0;
            }
            else {
              psVar60 = psVar51->buffer_start;
              iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
              if (iVar40 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar59 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar66 = 0;
              }
              else {
                psVar59 = psVar60 + iVar40;
                uVar66 = (uint)*psVar60;
              }
              psVar51->img_buffer_end = psVar59;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
              pbVar45 = psVar51->img_buffer;
              pbVar46 = psVar51->img_buffer_end;
            }
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar42 = (uint)*pbVar45;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar42 = 0;
            }
            else {
              psVar60 = psVar51->buffer_start;
              iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
              if (iVar40 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar59 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar42 = 0;
              }
              else {
                psVar59 = psVar60 + iVar40;
                uVar42 = (uint)*psVar60;
              }
              psVar51->img_buffer_end = psVar59;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
            }
            uVar73 = psVar51->img_n;
            if ((long)(int)uVar73 < 1) {
              uVar70 = 0;
            }
            else {
              uVar70 = 0;
              paVar57 = paVar1;
              while (paVar57->id != uVar66) {
                uVar70 = uVar70 + 1;
                paVar57 = paVar57 + 1;
                if ((long)(int)uVar73 == uVar70) goto LAB_0014a55f;
              }
            }
            if ((uint)uVar70 == uVar73) goto LAB_0014a55f;
            uVar71 = uVar70 & 0xffffffff;
            paVar57 = (anon_struct_96_18_0d0905d3 *)(uVar71 * 0x60);
            psVar44->img_comp[uVar71].hd = uVar42 >> 4;
            if (0x3f < (byte)uVar42) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_0014a558;
            }
            paVar57 = paVar1 + uVar71;
            paVar57->ha = uVar42 & 0xf;
            if (3 < (uVar42 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_0014a558;
            }
            psVar44->order[lVar55] = (uint)uVar70;
            lVar55 = lVar55 + 1;
          } while (lVar55 < psVar44->scan_n);
          pbVar46 = psVar51->img_buffer;
          pbVar45 = psVar51->img_buffer_end;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            bVar39 = *pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            bVar39 = 0;
          }
          else {
            psVar60 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar59 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              bVar39 = 0;
            }
            else {
              psVar59 = psVar60 + iVar40;
              bVar39 = *psVar60;
            }
            psVar51->img_buffer_end = psVar59;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_start = (uint)bVar39;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar73 = (uint)*pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar73 = 0;
          }
          else {
            psVar60 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar59 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar73 = 0;
            }
            else {
              psVar59 = psVar60 + iVar40;
              uVar73 = (uint)*psVar60;
            }
            psVar51->img_buffer_end = psVar59;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_end = uVar73;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar73 = (uint)*pbVar46;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar73 = 0;
          }
          else {
            psVar60 = psVar51->buffer_start;
            iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
            if (iVar40 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar59 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar73 = 0;
            }
            else {
              psVar59 = psVar60 + iVar40;
              uVar73 = (uint)*psVar60;
            }
            psVar51->img_buffer_end = psVar59;
            psVar51->img_buffer = psVar51->buffer_start + 1;
          }
          psVar44->succ_high = uVar73 >> 4;
          uVar66 = uVar73 & 0xf;
          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
          psVar44->succ_low = uVar66;
          iVar40 = psVar44->progressive;
          iVar67 = psVar44->spec_start;
          if (iVar40 == 0) {
            if ((iVar67 != 0) || ((0xf < (byte)uVar73 || (uVar66 != 0)))) {
LAB_0014ae70:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0014a558;
            }
            psVar44->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar67) || (0x3f < psVar44->spec_end)) || (psVar44->spec_end < iVar67))
                  || ((0xdf < (byte)uVar73 || (0xd < uVar66)))) goto LAB_0014ae70;
          uVar73 = psVar44->scan_n;
          uVar70 = (ulong)uVar73;
          iVar67 = psVar44->restart_interval;
          if (iVar67 == 0) {
            iVar67 = 0x7fffffff;
          }
          psVar44->code_buffer = 0;
          psVar44->code_bits = 0;
          psVar44->nomore = 0;
          psVar44->img_comp[3].dc_pred = 0;
          psVar44->img_comp[2].dc_pred = 0;
          psVar44->img_comp[1].dc_pred = 0;
          psVar44->img_comp[0].dc_pred = 0;
          psVar44->marker = 0xff;
          psVar44->todo = iVar67;
          psVar44->eob_run = 0;
          if (iVar40 == 0) {
            if (uVar73 == 1) {
              iVar40 = psVar44->order[0];
              iVar67 = psVar44->img_comp[iVar40].y + 7 >> 3;
              bVar75 = true;
              uVar73 = 1;
              if (0 < iVar67) {
                uVar66 = paVar1[iVar40].x + 7 >> 3;
                iVar65 = 0;
                iVar64 = 0;
                do {
                  if (0 < (int)uVar66) {
                    lVar55 = 0;
                    do {
                      iVar61 = stbi__jpeg_decode_block
                                         (psVar44,(short *)&local_88a8,
                                          (stbi__huffman *)psVar44->huff_dc[paVar1[iVar40].hd].fast,
                                          (stbi__huffman *)psVar44->huff_ac[paVar1[iVar40].ha].fast,
                                          psVar44->fast_ac[paVar1[iVar40].ha],iVar40,
                                          psVar44->dequant[paVar1[iVar40].tq]);
                      uVar73 = extraout_EDX_02;
                      if (iVar61 == 0) goto LAB_00149c3e;
                      (*psVar44->idct_block_kernel)
                                (paVar1[iVar40].data + lVar55 + iVar65 * paVar1[iVar40].w2,
                                 paVar1[iVar40].w2,(short *)&local_88a8);
                      uVar73 = (uint)extraout_RDX_02;
                      iVar61 = psVar44->todo;
                      psVar44->todo = iVar61 + -1;
                      uVar70 = extraout_RDX_02;
                      if (iVar61 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar73 = extraout_EDX_03;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_00149835;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar61 = psVar44->restart_interval;
                        uVar70 = 0x7fffffff;
                        if (iVar61 == 0) {
                          iVar61 = 0x7fffffff;
                        }
                        psVar44->todo = iVar61;
                        psVar44->eob_run = 0;
                      }
                      lVar55 = lVar55 + 8;
                    } while ((ulong)uVar66 * 8 != lVar55);
                  }
                  uVar73 = (uint)uVar70;
                  iVar64 = iVar64 + 1;
                  iVar65 = iVar65 + 8;
                } while (iVar64 != iVar67);
LAB_00149835:
                bVar75 = true;
              }
            }
            else {
              uVar73 = psVar44->img_mcu_y;
              uVar70 = (ulong)uVar73;
              bVar75 = true;
              if (0 < (int)uVar73) {
                iVar40 = psVar44->img_mcu_x;
                iVar64 = 0;
                do {
                  if (0 < iVar40) {
                    uVar66 = 0;
                    do {
                      iVar40 = psVar44->scan_n;
                      if (0 < iVar40) {
                        uVar70 = 0;
                        do {
                          iVar67 = psVar44->order[uVar70];
                          iVar65 = psVar44->img_comp[iVar67].v;
                          if (0 < iVar65) {
                            iVar40 = paVar1[iVar67].h;
                            iVar61 = 0;
                            local_88c8 = uVar70;
                            do {
                              if (0 < iVar40) {
                                iVar65 = 0;
                                do {
                                  iVar72 = paVar1[iVar67].v;
                                  iVar43 = stbi__jpeg_decode_block
                                                     (psVar44,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar67].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar44->huff_ac[paVar1[iVar67].ha].fast,
                                                      psVar44->fast_ac[paVar1[iVar67].ha],iVar67,
                                                      psVar44->dequant[paVar1[iVar67].tq]);
                                  uVar73 = extraout_EDX_05;
                                  if (iVar43 == 0) goto LAB_00149c3e;
                                  (*psVar44->idct_block_kernel)
                                            (paVar1[iVar67].data +
                                             (long)(int)((iVar40 * uVar66 + iVar65) * 8) +
                                             (long)((iVar72 * iVar64 + iVar61) * paVar1[iVar67].w2 *
                                                   8),paVar1[iVar67].w2,(short *)&local_88a8);
                                  iVar65 = iVar65 + 1;
                                  iVar40 = paVar1[iVar67].h;
                                } while (iVar65 < iVar40);
                                iVar65 = paVar1[iVar67].v;
                              }
                              iVar61 = iVar61 + 1;
                            } while (iVar61 < iVar65);
                            iVar40 = psVar44->scan_n;
                            uVar70 = local_88c8;
                          }
                          uVar70 = uVar70 + 1;
                        } while ((long)uVar70 < (long)iVar40);
                        iVar67 = psVar44->todo;
                      }
                      uVar73 = (uint)uVar70;
                      bVar75 = true;
                      psVar44->todo = iVar67 + -1;
                      bVar8 = iVar67 < 2;
                      iVar67 = iVar67 + -1;
                      if (bVar8) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar73 = extraout_EDX_06;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_00149c40;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar67 = psVar44->restart_interval;
                        if (iVar67 == 0) {
                          iVar67 = 0x7fffffff;
                        }
                        psVar44->todo = iVar67;
                        psVar44->eob_run = 0;
                      }
                      uVar66 = uVar66 + 1;
                      uVar70 = (ulong)uVar66;
                      iVar40 = psVar44->img_mcu_x;
                    } while ((int)uVar66 < iVar40);
                    uVar70 = (ulong)(uint)psVar44->img_mcu_y;
                  }
                  bVar75 = true;
                  iVar64 = iVar64 + 1;
                  uVar73 = (uint)uVar70;
                } while (iVar64 < (int)uVar73);
              }
            }
            goto LAB_00149c40;
          }
          if (uVar73 == 1) {
            iVar40 = psVar44->order[0];
            iVar67 = psVar44->img_comp[iVar40].y + 7 >> 3;
            if (0 < iVar67) {
              local_88b8 = paVar1 + iVar40;
              iVar64 = psVar44->img_comp[iVar40].x + 7 >> 3;
              local_8934 = 0;
              do {
                if (0 < iVar64) {
                  iVar65 = 0;
                  do {
                    psVar63 = local_88b8->coeff + (local_88b8->coeff_w * local_8934 + iVar65) * 0x40
                    ;
                    uVar70 = (ulong)psVar44->spec_start;
                    local_88c8 = CONCAT44(local_88c8._4_4_,iVar65);
                    if (uVar70 == 0) {
                      iVar65 = stbi__jpeg_decode_block_prog_dc
                                         (psVar44,psVar63,
                                          (stbi__huffman *)psVar44->huff_dc[local_88b8->hd].fast,
                                          iVar40);
                      uVar73 = extraout_EDX_01;
                      if (iVar65 == 0) goto LAB_0014a55f;
                    }
                    else {
                      iVar65 = local_88b8->ha;
                      iVar61 = psVar44->eob_run;
                      bVar39 = (byte)psVar44->succ_low;
                      if (psVar44->succ_high == 0) {
                        if (iVar61 == 0) {
                          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                          do {
                            if ((int)paVar57 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar44);
                            }
                            uVar73 = psVar44->code_buffer;
                            uVar71 = (ulong)(uVar73 >> 0x17);
                            sVar4 = psVar44->fast_ac[iVar65][uVar71];
                            uVar66 = (uint)sVar4;
                            iVar61 = (int)uVar70;
                            if (sVar4 == 0) {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                                uVar73 = psVar44->code_buffer;
                                uVar71 = (ulong)(uVar73 >> 0x17);
                              }
                              uVar70 = (ulong)psVar44->huff_ac[iVar65].fast[uVar71];
                              if (uVar70 == 0xff) {
                                lVar55 = 0;
                                do {
                                  lVar54 = lVar55;
                                  lVar55 = lVar54 + 1;
                                } while (psVar44->huff_ac[iVar65].maxcode[lVar54 + 10] <=
                                         uVar73 >> 0x10);
                                uVar66 = psVar44->code_bits;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                                if (lVar55 == 8) goto LAB_0014bba9;
                                if ((int)uVar66 < (int)(lVar54 + 10)) goto LAB_0014bbb3;
                                uVar70 = (ulong)(int)((uVar73 >> (0x17U - (char)lVar55 & 0x1f) &
                                                      stbi__bmask[lVar54 + 10]) +
                                                     psVar44->huff_ac[iVar65].delta[lVar54 + 10]);
                                bVar2 = psVar44->huff_ac[iVar65].size[uVar70];
                                if ((uVar73 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar44->huff_ac[iVar65].code[uVar70]) goto LAB_0014c1ef;
                                uVar66 = (uVar66 - (int)lVar55) - 9;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                                psVar44->code_bits = uVar66;
                                sVar41 = uVar73 << ((byte)(lVar54 + 10) & 0x1f);
                                psVar44->code_buffer = sVar41;
                              }
                              else {
                                bVar2 = psVar44->huff_ac[iVar65].size[uVar70];
                                uVar66 = psVar44->code_bits - (uint)bVar2;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                                if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_0014bbb3;
                                sVar41 = uVar73 << (bVar2 & 0x1f);
                                psVar44->code_buffer = sVar41;
                                psVar44->code_bits = uVar66;
                              }
                              bVar2 = psVar44->huff_ac[iVar65].values[uVar70];
                              uVar73 = bVar2 & 0xf;
                              bVar30 = bVar2 >> 4;
                              uVar66 = (uint)bVar30;
                              iVar72 = (int)paVar57;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar61 = 1 << bVar30;
                                  psVar44->eob_run = iVar61;
                                  if (0xf < bVar2) {
                                    if (iVar72 < (int)uVar66) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      sVar41 = psVar44->code_buffer;
                                      iVar72 = psVar44->code_bits;
                                      iVar61 = psVar44->eob_run;
                                    }
                                    uVar42 = sVar41 << bVar30 | sVar41 >> 0x20 - bVar30;
                                    uVar73 = stbi__bmask[uVar66];
                                    psVar44->code_buffer = ~uVar73 & uVar42;
                                    iVar61 = iVar61 + (uVar42 & uVar73);
                                    psVar44->code_bits = iVar72 - uVar66;
                                  }
                                  goto LAB_00148fe4;
                                }
                                uVar73 = iVar61 + 0x10;
                              }
                              else {
                                lVar55 = (long)iVar61 + (ulong)uVar66;
                                bVar2 = ""[lVar55];
                                if (iVar72 < (int)uVar73) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar72 = psVar44->code_bits;
                                }
                                uVar42 = sVar41 << (sbyte)uVar73 | sVar41 >> 0x20 - (sbyte)uVar73;
                                uVar66 = *(uint *)((long)stbi__bmask + (ulong)(uVar73 * 4));
                                psVar44->code_buffer = ~uVar66 & uVar42;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - uVar73);
                                psVar44->code_bits = iVar72 - uVar73;
                                iVar61 = 0;
                                if (-1 < (int)sVar41) {
                                  iVar61 = *(int *)((long)stbi__jbias + (ulong)(uVar73 * 4));
                                }
                                uVar73 = (int)lVar55 + 1;
                                psVar63[bVar2] =
                                     (short)((uVar42 & uVar66) + iVar61 << (bVar39 & 0x1f));
                              }
                            }
                            else {
                              lVar55 = (long)iVar61 + (ulong)(uVar66 >> 4 & 0xf);
                              psVar44->code_buffer = uVar73 << (sbyte)(uVar66 & 0xf);
                              uVar73 = psVar44->code_bits - (uVar66 & 0xf);
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar73;
                              psVar44->code_bits = uVar73;
                              uVar73 = (int)lVar55 + 1;
                              psVar63[""[lVar55]] = (short)((uVar66 >> 8) << (bVar39 & 0x1f));
                            }
                            uVar70 = (ulong)uVar73;
                          } while ((int)uVar73 <= psVar44->spec_end);
                        }
                        else {
LAB_00148fe4:
                          psVar44->eob_run = iVar61 + -1;
                        }
                      }
                      else if (iVar61 == 0) {
                        iVar61 = 0x10000 << (bVar39 & 0x1f);
                        paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                        do {
                          if ((int)paVar57 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar44);
                          }
                          uVar73 = psVar44->code_buffer;
                          uVar71 = (ulong)psVar44->huff_ac[iVar65].fast[uVar73 >> 0x17];
                          if (uVar71 == 0xff) {
                            lVar55 = 0;
                            do {
                              lVar54 = lVar55;
                              lVar55 = lVar54 + 1;
                            } while (psVar44->huff_ac[iVar65].maxcode[lVar54 + 10] <= uVar73 >> 0x10
                                    );
                            uVar66 = psVar44->code_bits;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                            if (lVar55 == 8) goto LAB_0014bba9;
                            if ((int)uVar66 < (int)(lVar54 + 10)) goto LAB_0014bbb3;
                            uVar71 = (ulong)(int)((uVar73 >> (0x17U - (char)lVar55 & 0x1f) &
                                                  stbi__bmask[lVar54 + 10]) +
                                                 psVar44->huff_ac[iVar65].delta[lVar54 + 10]);
                            bVar2 = psVar44->huff_ac[iVar65].size[uVar71];
                            if ((uVar73 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                (uint)psVar44->huff_ac[iVar65].code[uVar71]) {
LAB_0014c1ef:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image.h"
                                            ,0x75e,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar66 = (uVar66 - (int)lVar55) - 9;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                            psVar44->code_bits = uVar66;
                            sVar41 = uVar73 << ((byte)(lVar54 + 10) & 0x1f);
                            psVar44->code_buffer = sVar41;
                          }
                          else {
                            bVar2 = psVar44->huff_ac[iVar65].size[uVar71];
                            uVar66 = psVar44->code_bits - (uint)bVar2;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar66;
                            if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_0014bbb3;
                            sVar41 = uVar73 << (bVar2 & 0x1f);
                            psVar44->code_buffer = sVar41;
                            psVar44->code_bits = uVar66;
                          }
                          iVar72 = (int)paVar57;
                          bVar2 = psVar44->huff_ac[iVar65].values[uVar71];
                          bVar30 = bVar2 >> 4;
                          uVar73 = (uint)bVar30;
                          uVar71 = (ulong)uVar73;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar72 < 1) {
                              stbi__grow_buffer_unsafe(psVar44);
                              sVar41 = psVar44->code_buffer;
                              iVar72 = psVar44->code_bits;
                            }
                            sVar62 = sVar41 * 2;
                            psVar44->code_buffer = sVar62;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - 1U);
                            local_8944._0_2_ =
                                 (short)(((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f));
                            psVar44->code_bits = iVar72 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_0014bbb3;
                            if (bVar2 < 0xf0) {
                              uVar66 = ~(-1 << bVar30);
                              psVar44->eob_run = uVar66;
                              uVar68 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar72 < (int)uVar73) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar72 = psVar44->code_bits;
                                  uVar66 = psVar44->eob_run;
                                }
                                uVar56 = sVar41 << bVar30 | sVar41 >> 0x20 - bVar30;
                                uVar42 = stbi__bmask[uVar71];
                                sVar62 = ~uVar42 & uVar56;
                                psVar44->code_buffer = sVar62;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - uVar73);
                                psVar44->code_bits = iVar72 - uVar73;
                                psVar44->eob_run = (uVar56 & uVar42) + uVar66;
                                local_8944._0_2_ = 0;
                                uVar71 = uVar68;
                                goto LAB_00149221;
                              }
                            }
                            else {
                              uVar68 = 0xf;
                            }
                            local_8944._0_2_ = 0;
                            uVar71 = uVar68;
                            sVar62 = sVar41;
                          }
LAB_00149221:
                          uVar73 = psVar44->spec_end;
                          uVar68 = (ulong)uVar73;
                          if ((int)uVar70 <= (int)uVar73) {
                            uVar58 = (long)(int)uVar70;
                            do {
                              uVar73 = (uint)uVar68;
                              iVar72 = (int)paVar57;
                              bVar2 = ""[uVar58];
                              if (psVar63[bVar2] == 0) {
                                if ((int)uVar71 == 0) {
                                  uVar70 = (ulong)((int)uVar58 + 1);
                                  psVar63[bVar2] = (short)local_8944;
                                  break;
                                }
                                uVar71 = (ulong)((int)uVar71 - 1);
                              }
                              else {
                                if (iVar72 < 1) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar62 = psVar44->code_buffer;
                                  iVar72 = psVar44->code_bits;
                                }
                                sVar41 = sVar62 * 2;
                                psVar44->code_buffer = sVar41;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar72 - 1U);
                                psVar44->code_bits = iVar72 - 1U;
                                bVar75 = (int)sVar62 < 0;
                                sVar62 = sVar41;
                                if ((bVar75) &&
                                   (sVar4 = psVar63[bVar2], (iVar61 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar31 = (short)((uint)iVar61 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar31 = -sVar31;
                                  }
                                  psVar63[bVar2] = sVar4 + sVar31;
                                }
                              }
                              uVar70 = uVar58 + 1;
                              uVar73 = psVar44->spec_end;
                              uVar68 = (ulong)(int)uVar73;
                              bVar75 = (long)uVar58 < (long)uVar68;
                              uVar58 = uVar70;
                            } while (bVar75);
                          }
                        } while ((int)uVar70 <= (int)uVar73);
                      }
                      else {
                        psVar44->eob_run = iVar61 + -1;
                        if (psVar44->spec_start <= psVar44->spec_end) {
                          uVar73 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                          do {
                            bVar39 = ""[uVar70];
                            if (psVar63[bVar39] != 0) {
                              iVar65 = psVar44->code_bits;
                              if (iVar65 < 1) {
                                stbi__grow_buffer_unsafe(psVar44);
                                iVar65 = psVar44->code_bits;
                              }
                              sVar41 = psVar44->code_buffer;
                              psVar44->code_buffer = sVar41 * 2;
                              psVar44->code_bits = iVar65 + -1;
                              if (((int)sVar41 < 0) &&
                                 (sVar4 = psVar63[bVar39], (uVar73 & (int)sVar4) == 0)) {
                                uVar66 = -uVar73;
                                if (0 < sVar4) {
                                  uVar66 = uVar73;
                                }
                                psVar63[bVar39] = (short)uVar66 + sVar4;
                              }
                            }
                            bVar75 = (long)uVar70 < (long)psVar44->spec_end;
                            uVar70 = uVar70 + 1;
                          } while (bVar75);
                        }
                      }
                    }
                    iVar65 = psVar44->todo;
                    psVar44->todo = iVar65 + -1;
                    if (iVar65 < 2) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_00149c58;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar65 = psVar44->restart_interval;
                      if (iVar65 == 0) {
                        iVar65 = 0x7fffffff;
                      }
                      psVar44->todo = iVar65;
                      psVar44->eob_run = 0;
                    }
                    iVar65 = (int)local_88c8 + 1;
                  } while (iVar65 != iVar64);
                }
                local_8934 = local_8934 + 1;
              } while (local_8934 != iVar67);
            }
          }
          else {
            iVar40 = psVar44->img_mcu_y;
            if (0 < iVar40) {
              iVar64 = psVar44->img_mcu_x;
              iVar65 = 0;
              do {
                if (0 < iVar64) {
                  iVar40 = 0;
                  do {
                    iVar64 = psVar44->scan_n;
                    if (0 < iVar64) {
                      lVar55 = 0;
                      do {
                        iVar67 = psVar44->order[lVar55];
                        iVar61 = psVar44->img_comp[iVar67].v;
                        if (0 < iVar61) {
                          iVar64 = paVar1[iVar67].h;
                          iVar72 = 0;
                          do {
                            if (0 < iVar64) {
                              iVar61 = 0;
                              do {
                                iVar64 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar44,paVar1[iVar67].coeff +
                                                            (iVar64 * iVar40 + iVar61 +
                                                            (paVar1[iVar67].v * iVar65 + iVar72) *
                                                            paVar1[iVar67].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar44->huff_dc[paVar1[iVar67].hd].fast,iVar67)
                                ;
                                uVar73 = extraout_EDX_04;
                                if (iVar64 == 0) goto LAB_0014a55f;
                                iVar61 = iVar61 + 1;
                                iVar64 = paVar1[iVar67].h;
                              } while (iVar61 < iVar64);
                              iVar61 = paVar1[iVar67].v;
                            }
                            iVar72 = iVar72 + 1;
                          } while (iVar72 < iVar61);
                          iVar64 = psVar44->scan_n;
                        }
                        lVar55 = lVar55 + 1;
                      } while (lVar55 < iVar64);
                      iVar67 = psVar44->todo;
                    }
                    psVar44->todo = iVar67 + -1;
                    bVar75 = iVar67 < 2;
                    iVar67 = iVar67 + -1;
                    if (bVar75) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_00149c58;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar67 = psVar44->restart_interval;
                      if (iVar67 == 0) {
                        iVar67 = 0x7fffffff;
                      }
                      psVar44->todo = iVar67;
                      psVar44->eob_run = 0;
                    }
                    iVar40 = iVar40 + 1;
                    iVar64 = psVar44->img_mcu_x;
                  } while (iVar40 < iVar64);
                  iVar40 = psVar44->img_mcu_y;
                }
                iVar65 = iVar65 + 1;
              } while (iVar65 < iVar40);
            }
          }
          goto LAB_00149c4d;
        }
        uVar73 = (uint)bVar39;
        if (uVar73 == 0xdc) {
          iVar40 = stbi__get16be(psVar44->s);
          sVar41 = stbi__get16be(psVar44->s);
          paVar57 = extraout_RDX;
          if (iVar40 == 4) {
            if (sVar41 == psVar44->s->img_y) goto LAB_00148937;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_0014a558;
        }
        if (uVar73 == 0xd9) {
          psVar47 = psVar44->s;
          uVar73 = psVar47->img_n;
          if (psVar44->progressive == 0) goto LAB_0014a408;
          if ((int)uVar73 < 1) {
            uVar66 = req_comp + (uint)(req_comp == 0);
            bVar75 = false;
          }
          else {
            lVar55 = 0;
            do {
              iVar40 = psVar44->img_comp[lVar55].y + 7 >> 3;
              if (0 < iVar40) {
                uVar73 = paVar1[lVar55].x + 7 >> 3;
                iVar67 = 0;
                do {
                  if (0 < (int)uVar73) {
                    uVar70 = 0;
                    do {
                      psVar63 = paVar1[lVar55].coeff +
                                (paVar1[lVar55].coeff_w * iVar67 + (int)uVar70) * 0x40;
                      iVar64 = paVar1[lVar55].tq;
                      lVar54 = 0;
                      do {
                        psVar63[lVar54] = psVar63[lVar54] * psVar44->dequant[iVar64][lVar54];
                        lVar54 = lVar54 + 1;
                      } while (lVar54 != 0x40);
                      (*psVar44->idct_block_kernel)
                                (paVar1[lVar55].data +
                                 uVar70 * 8 + (long)(iVar67 * 8 * paVar1[lVar55].w2),
                                 paVar1[lVar55].w2,psVar63);
                      uVar70 = uVar70 + 1;
                    } while (uVar70 != uVar73);
                  }
                  iVar67 = iVar67 + 1;
                } while (iVar67 != iVar40);
                psVar47 = psVar44->s;
              }
              lVar55 = lVar55 + 1;
              uVar73 = psVar47->img_n;
            } while (lVar55 < (int)uVar73);
LAB_0014a408:
            uVar66 = (2 < (int)uVar73) + 1 + (uint)(2 < (int)uVar73);
            if (req_comp != 0) {
              uVar66 = req_comp;
            }
            uVar42 = uVar73;
            if (uVar73 == 3) {
              bVar75 = true;
              uVar73 = 3;
              if (psVar44->rgb != 3) {
                uVar42 = 3;
                if (psVar44->app14_color_transform != 0) goto LAB_0014a443;
                bVar75 = psVar44->jfif == 0;
              }
            }
            else {
LAB_0014a443:
              uVar73 = uVar42;
              bVar75 = false;
            }
          }
          uVar42 = 1;
          if (bVar75) {
            uVar42 = uVar73;
          }
          if (uVar73 != 3) {
            uVar42 = uVar73;
          }
          if (2 < (int)uVar66) {
            uVar42 = uVar73;
          }
          sVar41 = psVar47->img_x;
          if ((int)uVar42 < 1) {
LAB_0014b455:
            sVar62 = psVar47->img_y;
            psVar51 = (stbi__context *)stbi__malloc_mad3(uVar66,sVar41,sVar62,1);
            iVar40 = (int)extraout_RDX_03;
            if (psVar51 != (stbi__context *)0x0) {
              if (sVar62 != 0) {
                iVar67 = 0;
                uVar73 = 0;
                uVar70 = extraout_RDX_03;
                do {
                  sVar41 = psVar47->img_x;
                  if (0 < (int)uVar42) {
                    pasVar74 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar71 = 0;
                    piVar69 = &psVar44->img_comp[0].y;
                    do {
                      asVar5 = pasVar74[-1];
                      asVar6 = pasVar74[-3];
                      iVar40 = (int)asVar6 >> 1;
                      auVar114 = (**(code **)(pasVar74 + -10))
                                           (*(stbi_uc **)(piVar69 + 10),
                                            *(undefined8 *)
                                             (*pasVar74 +
                                             ((ulong)(iVar40 <= (int)asVar5) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar74 +
                                             ((ulong)((int)asVar5 < iVar40) << 3 |
                                             0xffffffffffffffe0)),pasVar74[-2],pasVar74[-4]);
                      uVar70 = auVar114._8_8_;
                      *(long *)(&local_88e8.bpp + uVar71 * 2) = auVar114._0_8_;
                      pasVar74[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar6 <= (int)asVar5 + 1) {
                        pasVar74[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar74 + -8) = *(stbi_uc **)(pasVar74 + -6);
                        asVar5 = *pasVar74;
                        *pasVar74 = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar5 + 1 < *piVar69) {
                          *(stbi_uc **)(pasVar74 + -6) = *(stbi_uc **)(pasVar74 + -6) + piVar69[1];
                        }
                      }
                      uVar71 = uVar71 + 1;
                      piVar69 = piVar69 + 0x18;
                      pasVar74 = pasVar74 + 0xc;
                    } while (uVar42 != uVar71);
                  }
                  if (2 < (int)uVar66) {
                    psVar60 = (stbi_uc *)CONCAT44(local_88e8.offset,local_88e8.bpp);
                    psVar47 = psVar44->s;
                    if (psVar47->img_n == 3) {
                      if (bVar75) {
                        if (psVar47->img_x != 0) {
                          psVar59 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x35);
                          uVar70 = 0;
                          do {
                            psVar59[-3] = psVar60[uVar70];
                            psVar59[-2] = *(undefined1 *)
                                           (CONCAT44(local_88e8.mr,local_88e8.hsz) + uVar70);
                            psVar59[-1] = *(undefined1 *)
                                           (CONCAT44(local_88e8.mb,local_88e8.mg) + uVar70);
                            *psVar59 = 0xff;
                            uVar70 = uVar70 + 1;
                            psVar59 = psVar59 + uVar66;
                          } while (uVar70 < psVar47->img_x);
                        }
                      }
                      else {
LAB_0014b928:
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar73 * uVar66 * sVar41) - 0x38),psVar60,
                                   (stbi_uc *)CONCAT44(local_88e8.mr,local_88e8.hsz),
                                   (stbi_uc *)CONCAT44(local_88e8.mb,local_88e8.mg),psVar47->img_x,
                                   uVar66);
                        psVar47 = psVar44->s;
                        uVar70 = extraout_RDX_04;
                      }
                    }
                    else if (psVar47->img_n == 4) {
                      if (psVar44->app14_color_transform == 2) {
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar73 * uVar66 * sVar41) - 0x38),psVar60,
                                   (stbi_uc *)CONCAT44(local_88e8.mr,local_88e8.hsz),
                                   (stbi_uc *)CONCAT44(local_88e8.mb,local_88e8.mg),psVar47->img_x,
                                   uVar66);
                        psVar47 = psVar44->s;
                        uVar70 = extraout_RDX_05;
                        if (psVar47->img_x != 0) {
                          psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x36);
                          uVar71 = 0;
                          do {
                            bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar71);
                            iVar40 = (psVar60[-2] ^ 0xff) * (uint)bVar39;
                            psVar60[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                            iVar40 = (psVar60[-1] ^ 0xff) * (uint)bVar39;
                            psVar60[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            iVar40 = (*psVar60 ^ 0xff) * (uint)bVar39;
                            uVar56 = iVar40 + 0x80U >> 8;
                            uVar70 = (ulong)uVar56;
                            *psVar60 = (byte)(iVar40 + uVar56 + 0x80 >> 8);
                            uVar71 = uVar71 + 1;
                            psVar60 = psVar60 + uVar66;
                          } while (uVar71 < psVar47->img_x);
                        }
                      }
                      else {
                        if (psVar44->app14_color_transform != 0) goto LAB_0014b928;
                        if (psVar47->img_x != 0) {
                          uVar70 = CONCAT44(local_88e8.mb,local_88e8.mg);
                          psVar59 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x35);
                          uVar71 = 0;
                          do {
                            bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar71);
                            iVar40 = (uint)psVar60[uVar71] * (uint)bVar39;
                            psVar59[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                            iVar40 = (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) + uVar71
                                                    ) * (uint)bVar39;
                            psVar59[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            iVar40 = (uint)*(byte *)(uVar70 + uVar71) * (uint)bVar39;
                            psVar59[-1] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                            *psVar59 = 0xff;
                            uVar71 = uVar71 + 1;
                            psVar59 = psVar59 + uVar66;
                          } while (uVar71 < psVar47->img_x);
                        }
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      psVar59 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x35);
                      uVar71 = 0;
                      do {
                        sVar38 = psVar60[uVar71];
                        psVar59[-1] = sVar38;
                        psVar59[-2] = sVar38;
                        psVar59[-3] = sVar38;
                        *psVar59 = 0xff;
                        uVar71 = uVar71 + 1;
                        psVar59 = psVar59 + uVar66;
                      } while (uVar71 < psVar47->img_x);
                    }
                    goto LAB_0014bb08;
                  }
                  psVar47 = psVar44->s;
                  if (bVar75) {
                    if (uVar66 == 1) {
                      if (psVar47->img_x != 0) {
                        uVar70 = 0;
                        do {
                          bVar39 = *(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar70);
                          psVar51->buffer_start[uVar70 + sVar41 * iVar67 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) +
                                                        uVar70) * 0x96 +
                                         (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp)
                                                        + uVar70) * 0x4d >> 8);
                          uVar70 = uVar70 + 1;
                        } while (uVar70 < psVar47->img_x);
LAB_0014b9c0:
                        uVar70 = CONCAT44(local_88e8.mb,local_88e8.mg);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar70 = 0;
                      do {
                        bVar39 = *(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar70);
                        psVar51->buffer_start[uVar70 * 2 + (ulong)(sVar41 * iVar67) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)*(byte *)(CONCAT44(local_88e8.mr,local_88e8.hsz) +
                                                      uVar70) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) +
                                                      uVar70) * 0x4d >> 8);
                        psVar51->buffer_start[uVar70 * 2 + (ulong)(sVar41 * iVar67) + -0x37] = 0xff;
                        uVar70 = uVar70 + 1;
                      } while (uVar70 < psVar47->img_x);
                      goto LAB_0014b9c0;
                    }
                  }
                  else if (psVar47->img_n == 4) {
                    if (psVar44->app14_color_transform == 2) {
                      if (psVar47->img_x != 0) {
                        psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x37);
                        uVar70 = 0;
                        do {
                          iVar40 = (*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar70) ^
                                   0xff) * (uint)*(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma)
                                                          + uVar70);
                          psVar60[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar60 = 0xff;
                          uVar70 = uVar70 + 1;
                          psVar60 = psVar60 + uVar66;
                        } while (uVar70 < psVar47->img_x);
                      }
                    }
                    else {
                      if (psVar44->app14_color_transform != 0) goto LAB_0014b8b5;
                      if (psVar47->img_x != 0) {
                        uVar70 = CONCAT44(local_88e8.mr,local_88e8.hsz);
                        psVar60 = psVar51->buffer_start + ((ulong)(sVar41 * iVar67) - 0x37);
                        uVar71 = 0;
                        do {
                          bVar39 = *(byte *)(CONCAT44(local_88e8.all_a,local_88e8.ma) + uVar71);
                          iVar40 = (uint)*(byte *)(CONCAT44(local_88e8.offset,local_88e8.bpp) +
                                                  uVar71) * (uint)bVar39;
                          iVar64 = (uint)*(byte *)(uVar70 + uVar71) * (uint)bVar39;
                          iVar65 = (uint)*(byte *)(CONCAT44(local_88e8.mb,local_88e8.mg) + uVar71) *
                                   (uint)bVar39;
                          psVar60[-1] = (char)(((iVar65 + 0x80U >> 8) + iVar65 + 0x80 >> 8) * 0x1d +
                                               (iVar64 + (iVar64 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar60 = 0xff;
                          uVar71 = uVar71 + 1;
                          psVar60 = psVar60 + uVar66;
                        } while (uVar71 < psVar47->img_x);
                      }
                    }
                  }
                  else {
LAB_0014b8b5:
                    if (uVar66 == 1) {
                      if (psVar47->img_x != 0) {
                        uVar71 = 0;
                        do {
                          psVar51->buffer_start[uVar71 + sVar41 * iVar67 + -0x38] =
                               *(stbi_uc *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar71);
                          uVar71 = uVar71 + 1;
                          uVar70 = (ulong)psVar47->img_x;
                        } while (uVar71 < uVar70);
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      uVar71 = 0;
                      do {
                        psVar51->buffer_start[uVar71 * 2 + (ulong)(sVar41 * iVar67) + -0x38] =
                             *(stbi_uc *)(CONCAT44(local_88e8.offset,local_88e8.bpp) + uVar71);
                        psVar51->buffer_start[uVar71 * 2 + (ulong)(sVar41 * iVar67) + -0x37] = 0xff;
                        uVar71 = uVar71 + 1;
                        uVar70 = (ulong)psVar47->img_x;
                      } while (uVar71 < uVar70);
                    }
                  }
LAB_0014bb08:
                  iVar40 = (int)uVar70;
                  uVar73 = uVar73 + 1;
                  iVar67 = iVar67 + uVar66;
                } while (uVar73 < psVar47->img_y);
                uVar73 = psVar47->img_n;
              }
              stbi__free_jpeg_components(psVar44,uVar73,iVar40);
              psVar47 = psVar44->s;
              *x = psVar47->img_x;
              *y = psVar47->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar47->img_n) * 2 + 1;
              }
              goto LAB_0014a579;
            }
            stbi__free_jpeg_components(psVar44,uVar73,iVar40);
            stbi__g_failure_reason = "outofmem";
            goto LAB_0014a573;
          }
          lVar55 = 0;
          while( true ) {
            pvVar49 = malloc((ulong)(sVar41 + 3));
            *(void **)((long)&psVar44->img_comp[0].linebuf + lVar55 * 2) = pvVar49;
            if (pvVar49 == (void *)0x0) break;
            uVar70 = (long)psVar44->img_h_max /
                     (long)*(int *)((long)&psVar44->img_comp[0].h + lVar55 * 2);
            iVar40 = (int)uVar70;
            *(int *)((long)(local_88a8.pal + -7) + lVar55) = iVar40;
            iVar67 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar55 * 2);
            *(int *)((long)(local_88a8.pal + -6) + lVar55) = iVar67;
            *(int *)((long)(local_88a8.pal + -4) + lVar55) = iVar67 >> 1;
            *(int *)((long)(local_88a8.pal + -5) + lVar55) =
                 (int)((ulong)((sVar41 - 1) + iVar40) / (uVar70 & 0xffffffff));
            *(undefined4 *)((long)(local_88a8.pal + -3) + lVar55) = 0;
            uVar7 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar55 * 2);
            *(undefined8 *)((long)(local_88a8.pal + -9) + lVar55) = uVar7;
            *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar55) = uVar7;
            if (iVar40 == 2) {
              pcVar50 = stbi__resample_row_h_2;
              if (iVar67 != 1) {
                if (iVar67 != 2) goto LAB_0014b439;
                pcVar50 = psVar44->resample_row_hv_2_kernel;
              }
            }
            else if (iVar40 == 1) {
              pcVar50 = stbi__resample_row_generic;
              if (iVar67 == 2) {
                pcVar50 = stbi__resample_row_v_2;
              }
              if (iVar67 == 1) {
                pcVar50 = resample_row_1;
              }
            }
            else {
LAB_0014b439:
              pcVar50 = stbi__resample_row_generic;
            }
            *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar55) = pcVar50;
            lVar55 = lVar55 + 0x30;
            if ((ulong)uVar42 * 0x30 == lVar55) goto LAB_0014b455;
          }
          stbi__free_jpeg_components(psVar44,uVar73,why);
          stbi__g_failure_reason = "outofmem";
          psVar51 = (stbi__context *)0x0;
          goto LAB_0014a579;
        }
        iVar40 = stbi__process_marker(psVar44,uVar73);
        uVar73 = extraout_EDX_00;
        if (iVar40 != 0) goto LAB_00148937;
      }
LAB_0014a55f:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,uVar73);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0014a573:
    psVar51 = (stbi__context *)0x0;
LAB_0014a579:
    free(psVar44);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar53 = s->img_buffer_original;
    psVar59 = s->img_buffer_original_end;
    s->img_buffer = psVar53;
    s->img_buffer_end = psVar59;
    if (iVar40 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        uVar7 = local_88a8._0_8_;
        if (iVar40 == 0) {
          psVar51 = (stbi__context *)0x0;
        }
        else {
          iVar40 = 8;
          if (8 < local_88a8.flags) {
            iVar40 = local_88a8.flags;
          }
          ri->bits_per_channel = iVar40;
          psVar51 = (stbi__context *)local_88a8.history;
          if ((req_comp != 0) && (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 != req_comp)) {
            if (local_88a8.flags < 9) {
              psVar51 = (stbi__context *)
                        stbi__convert_format
                                  (local_88a8.history,iVar40,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            else {
              psVar51 = (stbi__context *)
                        stbi__convert_format16
                                  ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            *(int *)(uVar7 + 0xc) = req_comp;
            if (psVar51 == (stbi__context *)0x0) goto LAB_00148842;
          }
          *x = *(stbi__uint32 *)uVar7;
          *y = *(stbi__uint32 *)(uVar7 + 4);
          if (comp != (int *)0x0) {
            *comp = *(int *)(uVar7 + 8);
          }
          local_88a8.history = (stbi_uc *)0x0;
        }
        free(local_88a8.history);
        free(local_88a8.background);
        psVar44 = (stbi__jpeg *)local_88a8.out;
        goto LAB_0014a579;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_00148842;
    }
    if (psVar53 < psVar59) {
      psVar48 = psVar53 + 1;
      s->img_buffer = psVar48;
      sVar38 = *psVar53;
LAB_00149e79:
      if (sVar38 != 'B') goto LAB_0014a05d;
      if (psVar48 < psVar59) {
        s->img_buffer = psVar48 + 1;
        sVar38 = *psVar48;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0014a05d;
        psVar59 = s->buffer_start;
        iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
        if (iVar40 == 0) {
          s->read_from_callbacks = 0;
          psVar53 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar53 = psVar59 + iVar40;
          sVar38 = *psVar59;
        }
        s->img_buffer_end = psVar53;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar38 != 'M') goto LAB_0014a05d;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar73 = stbi__get16le(s);
      iVar40 = stbi__get16le(s);
      uVar73 = iVar40 << 0x10 | uVar73;
      if (((0x38 < uVar73) || ((0x100010000001000U >> ((ulong)uVar73 & 0x3f) & 1) == 0)) &&
         (uVar73 != 0x6c)) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar73 == 0x7c) goto LAB_00149fc8;
        goto LAB_0014a06d;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_00149fc8:
      local_88e8.all_a = 0xff;
      pvVar49 = stbi__bmp_parse_header(s,&local_88e8);
      uVar73 = local_88e8.all_a;
      if (pvVar49 == (void *)0x0) goto LAB_00148842;
      local_88b0 = s->img_y;
      sVar41 = -local_88b0;
      if (0 < (int)local_88b0) {
        sVar41 = local_88b0;
      }
      s->img_y = sVar41;
      if (local_88e8.hsz == 0xc) {
        if (local_88e8.bpp < 0x18) {
          local_8970 = (ulong)(uint)((local_88e8.offset + -0x26) / 3);
        }
        else {
LAB_0014a1bf:
          local_8970 = 0;
        }
      }
      else {
        if (0xf < local_88e8.bpp) goto LAB_0014a1bf;
        local_8970 = (ulong)(uint)((local_88e8.offset - local_88e8.hsz) + -0xe >> 2);
      }
      iVar40 = 4 - (uint)(local_88e8.ma == 0);
      s->img_n = iVar40;
      if (2 < req_comp) {
        iVar40 = req_comp;
      }
      sVar62 = s->img_x;
      iVar67 = stbi__mad3sizes_valid(iVar40,sVar62,sVar41,0);
      if (iVar67 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_00 = (uchar *)stbi__malloc_mad3(iVar40,sVar62,sVar41,0);
        if (data_00 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_88e8.bpp < 0x10) {
            iVar67 = (int)local_8970;
            if (0x100 < iVar67 || iVar67 == 0) {
              free(data_00);
              stbi__g_failure_reason = "invalid";
              goto LAB_00148842;
            }
            if (0 < iVar67) {
              psVar60 = s->buffer_start;
              psVar59 = s->buffer_start + 1;
              psVar53 = s->img_buffer;
              psVar48 = s->img_buffer_end;
              uVar70 = 0;
              do {
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar59;
                  }
                  else {
                    sVar38 = *psVar60;
                    psVar48 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar59;
                  psVar53 = psVar59;
                }
                local_88a8.pal[uVar70 - 0xd][2] = sVar38;
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar59;
                  }
                  else {
                    sVar38 = *psVar60;
                    psVar48 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar59;
                  psVar53 = psVar59;
                }
                local_88a8.pal[uVar70 - 0xd][1] = sVar38;
                if (psVar53 < psVar48) {
                  s->img_buffer = psVar53 + 1;
                  sVar38 = *psVar53;
                  psVar53 = psVar53 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar38 = '\0';
                }
                else {
                  iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar64 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar38 = '\0';
                    psVar48 = psVar59;
                  }
                  else {
                    sVar38 = *psVar60;
                    psVar48 = psVar60 + iVar64;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar59;
                  psVar53 = psVar59;
                }
                local_88a8.pal[uVar70 - 0xd][0] = sVar38;
                if (local_88e8.hsz != 0xc) {
                  if (psVar53 < psVar48) {
                    psVar53 = psVar53 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_0014a74b;
                    iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar64 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar48 = psVar59;
                    }
                    else {
                      psVar48 = psVar60 + iVar64;
                    }
                    s->img_buffer_end = psVar48;
                    psVar53 = psVar59;
                  }
                  s->img_buffer = psVar53;
                }
LAB_0014a74b:
                local_88a8.pal[uVar70 - 0xd][3] = 0xff;
                uVar70 = uVar70 + 1;
              } while (local_8970 != uVar70);
            }
            stbi__skip(s,(iVar67 * (local_88e8.hsz == 0xc | 0xfffffffc) - local_88e8.hsz) +
                         local_88e8.offset + -0xe);
            if (local_88e8.bpp == 1) {
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                sVar62 = s->img_x;
                psVar60 = s->buffer_start;
                psVar59 = s->buffer_start + 1;
                iVar64 = 0;
                iVar67 = 0;
                do {
                  psVar53 = s->img_buffer;
                  psVar48 = s->img_buffer_end;
                  if (psVar53 < psVar48) {
                    s->img_buffer = psVar53 + 1;
                    bVar39 = *psVar53;
                    psVar53 = psVar53 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar39 = 0;
                  }
                  else {
                    iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar65 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar39 = 0;
                      psVar48 = psVar59;
                    }
                    else {
                      bVar39 = *psVar60;
                      psVar48 = psVar60 + iVar65;
                    }
                    s->img_buffer_end = psVar48;
                    s->img_buffer = psVar59;
                    psVar53 = psVar59;
                  }
                  sVar41 = s->img_x;
                  if (0 < (int)sVar41) {
                    uVar66 = (uint)bVar39;
                    puVar52 = data_00 + (long)iVar64 + 2;
                    iVar65 = 0;
                    uVar42 = 7;
                    do {
                      uVar70 = (ulong)((uVar66 >> (uVar42 & 0x1f) & 1) != 0);
                      puVar52[-2] = local_88a8.pal[uVar70 - 0xd][0];
                      puVar52[-1] = local_88a8.pal[uVar70 - 0xd][1];
                      *puVar52 = local_88a8.pal[uVar70 - 0xd][2];
                      if ((int)uVar42 < 1) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          uVar66 = (uint)*psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar66 = 0;
                        }
                        else {
                          iVar61 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar61 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar66 = 0;
                            psVar48 = psVar59;
                          }
                          else {
                            uVar66 = (uint)*psVar60;
                            psVar48 = psVar60 + iVar61;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar59;
                          sVar41 = s->img_x;
                          psVar53 = psVar59;
                        }
                        uVar42 = 7;
                      }
                      else {
                        uVar42 = uVar42 - 1;
                      }
                      iVar65 = iVar65 + 1;
                      iVar64 = iVar64 + 3;
                      puVar52 = puVar52 + 3;
                    } while (iVar65 < (int)sVar41);
                  }
                  stbi__skip(s,-(sVar62 + 7 >> 3) & 3);
                  iVar67 = iVar67 + 1;
                  sVar41 = s->img_y;
                } while (iVar67 < (int)sVar41);
              }
            }
            else {
              if (local_88e8.bpp == 8) {
                uVar66 = s->img_x;
              }
              else {
                if (local_88e8.bpp != 4) {
                  free(data_00);
                  stbi__g_failure_reason = "bad bpp";
                  goto LAB_00148842;
                }
                uVar66 = s->img_x + 1 >> 1;
              }
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                local_8930 = -uVar66 & 3;
                psVar60 = s->buffer_start;
                psVar59 = s->buffer_start + 1;
                uVar70 = 0;
                iVar67 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    psVar53 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar64 = 0;
                    do {
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar65 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar59;
                        }
                        else {
                          bVar39 = *psVar60;
                          psVar48 = psVar60 + iVar65;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar59;
                        psVar53 = psVar59;
                      }
                      uVar66 = (uint)(bVar39 >> 4);
                      if (local_88e8.bpp != 4) {
                        uVar66 = (uint)bVar39;
                      }
                      uVar71 = (ulong)uVar66;
                      uVar66 = bVar39 & 0xf;
                      if (local_88e8.bpp != 4) {
                        uVar66 = 0;
                      }
                      lVar55 = (long)(int)uVar70;
                      uVar68 = lVar55 + 3;
                      data_00[lVar55] = local_88a8.pal[uVar71 - 0xd][0];
                      data_00[lVar55 + 1] = local_88a8.pal[uVar71 - 0xd][1];
                      data_00[lVar55 + 2] = local_88a8.pal[uVar71 - 0xd][2];
                      if (iVar40 == 4) {
                        data_00[lVar55 + 3] = 0xff;
                        uVar68 = (ulong)((int)uVar70 + 4);
                      }
                      if (iVar64 + 1U == s->img_x) {
                        uVar70 = uVar68 & 0xffffffff;
                        break;
                      }
                      if (local_88e8.bpp == 8) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          bVar39 = *psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar65 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar65 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar48 = psVar59;
                          }
                          else {
                            bVar39 = *psVar60;
                            psVar48 = psVar60 + iVar65;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar59;
                          psVar53 = psVar59;
                        }
                        uVar66 = (uint)bVar39;
                      }
                      lVar55 = (long)(int)uVar68;
                      uVar70 = lVar55 + 3;
                      uVar71 = (ulong)uVar66;
                      data_00[lVar55] = local_88a8.pal[uVar71 - 0xd][0];
                      data_00[lVar55 + 1] = local_88a8.pal[uVar71 - 0xd][1];
                      data_00[lVar55 + 2] = local_88a8.pal[uVar71 - 0xd][2];
                      if (iVar40 == 4) {
                        data_00[lVar55 + 3] = 0xff;
                        uVar70 = (ulong)((int)uVar68 + 4);
                      }
                      iVar64 = iVar64 + 2;
                    } while (iVar64 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8930);
                  iVar67 = iVar67 + 1;
                  sVar41 = s->img_y;
                } while (iVar67 < (int)sVar41);
              }
            }
          }
          else {
            stbi__skip(s,(local_88e8.offset - local_88e8.hsz) + -0xe);
            if (local_88e8.bpp == 0x10) {
              local_88ec = s->img_x * 2 & 2;
LAB_0014a8c2:
              if (local_88e8.mb == 0 || (local_88e8.mg == 0 || local_88e8.mr == 0)) {
                free(data_00);
                stbi__g_failure_reason = "bad masks";
                goto LAB_00148842;
              }
              iVar67 = stbi__high_bit(local_88e8.mr);
              iVar67 = iVar67 + -7;
              uVar66 = (local_88e8.mr >> 1 & 0x55555555) + (local_88e8.mr & 0x55555555);
              uVar66 = (uVar66 >> 2 & 0x33333333) + (uVar66 & 0x33333333);
              uVar66 = (uVar66 >> 4) + uVar66 & 0xf0f0f0f;
              uVar66 = (uVar66 >> 8) + uVar66;
              uVar66 = (uVar66 >> 0x10) + uVar66 & 0xff;
              iVar64 = stbi__high_bit(local_88e8.mg);
              local_88c8 = CONCAT44(local_88c8._4_4_,iVar64 + -7);
              uVar42 = (local_88e8.mg >> 1 & 0x55555555) + (local_88e8.mg & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_8944 = (uVar42 >> 0x10) + uVar42 & 0xff;
              local_8934 = stbi__high_bit(local_88e8.mb);
              local_8934 = local_8934 + -7;
              uVar42 = (local_88e8.mb >> 1 & 0x55555555) + (local_88e8.mb & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)
                           (CONCAT44(local_88b8._4_4_,(uVar42 >> 0x10) + uVar42) &
                           0xffffffff000000ff);
              local_8904 = stbi__high_bit(local_88e8.ma);
              local_8904 = local_8904 + -7;
              uVar42 = (local_88e8.ma >> 1 & 0x55555555) + (local_88e8.ma & 0x55555555);
              uVar42 = (uVar42 >> 2 & 0x33333333) + (uVar42 & 0x33333333);
              uVar42 = (uVar42 >> 4) + uVar42 & 0xf0f0f0f;
              uVar42 = (uVar42 >> 8) + uVar42;
              local_88bc = (uVar42 >> 0x10) + uVar42 & 0xff;
              local_88c0 = 1;
              bVar75 = false;
            }
            else {
              if (local_88e8.bpp == 0x20) {
                local_88ec = 0;
                if (local_88e8.ma != 0xff000000 ||
                    (local_88e8.mr != 0xff0000 || (local_88e8.mg != 0xff00 || local_88e8.mb != 0xff)
                    )) goto LAB_0014a8c2;
                bVar75 = true;
              }
              else {
                local_88ec = 0;
                if (local_88e8.bpp != 0x18) goto LAB_0014a8c2;
                local_88ec = s->img_x & 3;
                bVar75 = false;
              }
              local_88c0 = 0;
              iVar67 = 0;
              local_88c8 = local_88c8 & 0xffffffff00000000;
              local_8934 = 0;
              local_8904 = 0;
              uVar66 = 0;
              local_8944 = 0;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88b8 & 0xffffffff00000000);
              local_88bc = 0;
            }
            sVar41 = s->img_y;
            if (0 < (int)sVar41) {
              psVar60 = s->buffer_start;
              psVar59 = s->buffer_start + 1;
              iVar65 = 0;
              iVar64 = 0;
              do {
                local_88ac = iVar64;
                if ((char)local_88c0 == '\0') {
                  if (0 < (int)s->img_x) {
                    psVar53 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar64 = 0;
                    do {
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar61 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar61 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar59;
                        }
                        else {
                          bVar39 = *psVar60;
                          psVar48 = psVar60 + iVar61;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar59;
                        psVar53 = psVar59;
                      }
                      data_00[(long)iVar65 + 2] = bVar39;
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar61 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar61 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar59;
                        }
                        else {
                          bVar39 = *psVar60;
                          psVar48 = psVar60 + iVar61;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar59;
                        psVar53 = psVar59;
                      }
                      data_00[(long)iVar65 + 1] = bVar39;
                      if (psVar53 < psVar48) {
                        s->img_buffer = psVar53 + 1;
                        bVar39 = *psVar53;
                        psVar53 = psVar53 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar39 = 0;
                      }
                      else {
                        iVar61 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar61 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar39 = 0;
                          psVar48 = psVar59;
                        }
                        else {
                          bVar39 = *psVar60;
                          psVar48 = psVar60 + iVar61;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar59;
                        psVar53 = psVar59;
                      }
                      data_00[iVar65] = bVar39;
                      bVar39 = 0xff;
                      if (bVar75) {
                        if (psVar53 < psVar48) {
                          s->img_buffer = psVar53 + 1;
                          bVar39 = *psVar53;
                          psVar53 = psVar53 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar61 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar61 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar48 = psVar59;
                          }
                          else {
                            bVar39 = *psVar60;
                            psVar48 = psVar60 + iVar61;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar59;
                          psVar53 = psVar59;
                        }
                      }
                      iVar61 = iVar65 + 3;
                      if (iVar40 == 4) {
                        data_00[(long)iVar65 + 3] = bVar39;
                        iVar61 = iVar65 + 4;
                      }
                      iVar65 = iVar61;
                      uVar73 = uVar73 | bVar39;
                      iVar64 = iVar64 + 1;
                    } while (iVar64 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar64 = 0;
                  do {
                    uVar42 = stbi__get16le(s);
                    if (local_88e8.bpp != 0x10) {
                      iVar61 = stbi__get16le(s);
                      uVar42 = uVar42 | iVar61 << 0x10;
                    }
                    iVar61 = stbi__shiftsigned(uVar42 & local_88e8.mr,iVar67,uVar66);
                    data_00[iVar65] = (uchar)iVar61;
                    iVar61 = stbi__shiftsigned(uVar42 & local_88e8.mg,(int)local_88c8,local_8944);
                    data_00[(long)iVar65 + 1] = (uchar)iVar61;
                    iVar61 = stbi__shiftsigned(uVar42 & local_88e8.mb,local_8934,(int)local_88b8);
                    data_00[(long)iVar65 + 2] = (uchar)iVar61;
                    if (local_88e8.ma == 0) {
                      uVar42 = 0xff;
                    }
                    else {
                      uVar42 = stbi__shiftsigned(uVar42 & local_88e8.ma,local_8904,local_88bc);
                    }
                    iVar61 = iVar65 + 3;
                    if (iVar40 == 4) {
                      data_00[(long)iVar65 + 3] = (uchar)uVar42;
                      iVar61 = iVar65 + 4;
                    }
                    iVar65 = iVar61;
                    uVar73 = uVar73 | uVar42;
                    iVar64 = iVar64 + 1;
                  } while (iVar64 < (int)s->img_x);
                }
                stbi__skip(s,local_88ec);
                iVar64 = local_88ac + 1;
                sVar41 = s->img_y;
              } while (iVar64 < (int)sVar41);
            }
          }
          auVar37 = _DAT_001af420;
          auVar36 = _DAT_001af410;
          auVar35 = _DAT_001af400;
          auVar34 = _DAT_001af3f0;
          auVar33 = _DAT_001af3e0;
          auVar32 = _DAT_001af270;
          auVar114 = _DAT_001af1e0;
          if (((iVar40 == 4) && (uVar73 == 0)) &&
             (uVar73 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar73)) {
            uVar66 = uVar73 >> 2;
            auVar76._4_4_ = 0;
            auVar76._0_4_ = uVar66;
            auVar76._8_4_ = uVar66;
            auVar76._12_4_ = 0;
            puVar52 = data_00 + uVar73;
            uVar70 = 0;
            do {
              auVar94._8_4_ = (int)uVar70;
              auVar94._0_8_ = uVar70;
              auVar94._12_4_ = (int)(uVar70 >> 0x20);
              auVar96 = auVar76 | auVar114;
              auVar98 = (auVar94 | auVar32) ^ auVar114;
              iVar67 = auVar96._0_4_;
              iVar72 = -(uint)(iVar67 < auVar98._0_4_);
              iVar64 = auVar96._4_4_;
              auVar100._4_4_ = -(uint)(iVar64 < auVar98._4_4_);
              iVar65 = auVar96._8_4_;
              iVar43 = -(uint)(iVar65 < auVar98._8_4_);
              iVar61 = auVar96._12_4_;
              auVar100._12_4_ = -(uint)(iVar61 < auVar98._12_4_);
              auVar77._4_4_ = iVar72;
              auVar77._0_4_ = iVar72;
              auVar77._8_4_ = iVar43;
              auVar77._12_4_ = iVar43;
              auVar77 = pshuflw(in_XMM1,auVar77,0xe8);
              auVar99._4_4_ = -(uint)(auVar98._4_4_ == iVar64);
              auVar99._12_4_ = -(uint)(auVar98._12_4_ == iVar61);
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar86 = pshuflw(in_XMM2,auVar99,0xe8);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar98 = pshuflw(auVar77,auVar100,0xe8);
              auVar96._8_4_ = 0xffffffff;
              auVar96._0_8_ = 0xffffffffffffffff;
              auVar96._12_4_ = 0xffffffff;
              auVar96 = (auVar98 | auVar86 & auVar77) ^ auVar96;
              auVar96 = packssdw(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar52 = 0xff;
              }
              auVar86._4_4_ = iVar72;
              auVar86._0_4_ = iVar72;
              auVar86._8_4_ = iVar43;
              auVar86._12_4_ = iVar43;
              auVar100 = auVar99 & auVar86 | auVar100;
              auVar96 = packssdw(auVar100,auVar100);
              auVar98._8_4_ = 0xffffffff;
              auVar98._0_8_ = 0xffffffffffffffff;
              auVar98._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar98,auVar96 ^ auVar98);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 8 & 1) != 0) {
                puVar52[-4] = 0xff;
              }
              auVar96 = (auVar94 | auVar37) ^ auVar114;
              auVar87._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar87._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar87._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar87._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar101._4_4_ = auVar87._0_4_;
              auVar101._0_4_ = auVar87._0_4_;
              auVar101._8_4_ = auVar87._8_4_;
              auVar101._12_4_ = auVar87._8_4_;
              iVar72 = -(uint)(auVar96._4_4_ == iVar64);
              iVar43 = -(uint)(auVar96._12_4_ == iVar61);
              auVar18._4_4_ = iVar72;
              auVar18._0_4_ = iVar72;
              auVar18._8_4_ = iVar43;
              auVar18._12_4_ = iVar43;
              auVar111._4_4_ = auVar87._4_4_;
              auVar111._0_4_ = auVar87._4_4_;
              auVar111._8_4_ = auVar87._12_4_;
              auVar111._12_4_ = auVar87._12_4_;
              auVar96 = auVar18 & auVar101 | auVar111;
              auVar96 = packssdw(auVar96,auVar96);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar9,auVar96 ^ auVar9);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 0x10 & 1) != 0) {
                puVar52[-8] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar101,0x84);
              auVar19._4_4_ = iVar72;
              auVar19._0_4_ = iVar72;
              auVar19._8_4_ = iVar43;
              auVar19._12_4_ = iVar43;
              auVar98 = pshufhw(auVar87,auVar19,0x84);
              auVar77 = pshufhw(auVar96,auVar111,0x84);
              auVar78._8_4_ = 0xffffffff;
              auVar78._0_8_ = 0xffffffffffffffff;
              auVar78._12_4_ = 0xffffffff;
              auVar78 = (auVar77 | auVar98 & auVar96) ^ auVar78;
              auVar96 = packssdw(auVar78,auVar78);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._0_4_ >> 0x18 & 1) != 0) {
                puVar52[-0xc] = 0xff;
              }
              auVar96 = (auVar94 | auVar36) ^ auVar114;
              auVar88._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar88._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar88._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar88._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar20._4_4_ = auVar88._0_4_;
              auVar20._0_4_ = auVar88._0_4_;
              auVar20._8_4_ = auVar88._8_4_;
              auVar20._12_4_ = auVar88._8_4_;
              auVar98 = pshuflw(auVar111,auVar20,0xe8);
              auVar79._0_4_ = -(uint)(auVar96._0_4_ == iVar67);
              auVar79._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
              auVar79._8_4_ = -(uint)(auVar96._8_4_ == iVar65);
              auVar79._12_4_ = -(uint)(auVar96._12_4_ == iVar61);
              auVar102._4_4_ = auVar79._4_4_;
              auVar102._0_4_ = auVar79._4_4_;
              auVar102._8_4_ = auVar79._12_4_;
              auVar102._12_4_ = auVar79._12_4_;
              auVar96 = pshuflw(auVar79,auVar102,0xe8);
              auVar103._4_4_ = auVar88._4_4_;
              auVar103._0_4_ = auVar88._4_4_;
              auVar103._8_4_ = auVar88._12_4_;
              auVar103._12_4_ = auVar88._12_4_;
              auVar77 = pshuflw(auVar88,auVar103,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 & auVar98,(auVar77 | auVar96 & auVar98) ^ auVar10);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar88._0_4_;
              auVar21._0_4_ = auVar88._0_4_;
              auVar21._8_4_ = auVar88._8_4_;
              auVar21._12_4_ = auVar88._8_4_;
              auVar103 = auVar102 & auVar21 | auVar103;
              auVar77 = packssdw(auVar103,auVar103);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96,auVar77 ^ auVar11);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._4_2_ >> 8 & 1) != 0) {
                puVar52[-0x14] = 0xff;
              }
              auVar96 = (auVar94 | auVar35) ^ auVar114;
              auVar89._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar89._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar89._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar89._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar104._4_4_ = auVar89._0_4_;
              auVar104._0_4_ = auVar89._0_4_;
              auVar104._8_4_ = auVar89._8_4_;
              auVar104._12_4_ = auVar89._8_4_;
              iVar72 = -(uint)(auVar96._4_4_ == iVar64);
              iVar43 = -(uint)(auVar96._12_4_ == iVar61);
              auVar22._4_4_ = iVar72;
              auVar22._0_4_ = iVar72;
              auVar22._8_4_ = iVar43;
              auVar22._12_4_ = iVar43;
              auVar112._4_4_ = auVar89._4_4_;
              auVar112._0_4_ = auVar89._4_4_;
              auVar112._8_4_ = auVar89._12_4_;
              auVar112._12_4_ = auVar89._12_4_;
              auVar96 = auVar22 & auVar104 | auVar112;
              auVar96 = packssdw(auVar96,auVar96);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar12,auVar96 ^ auVar12);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x18] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar104,0x84);
              auVar23._4_4_ = iVar72;
              auVar23._0_4_ = iVar72;
              auVar23._8_4_ = iVar43;
              auVar23._12_4_ = iVar43;
              auVar98 = pshufhw(auVar89,auVar23,0x84);
              auVar77 = pshufhw(auVar96,auVar112,0x84);
              auVar80._8_4_ = 0xffffffff;
              auVar80._0_8_ = 0xffffffffffffffff;
              auVar80._12_4_ = 0xffffffff;
              auVar80 = (auVar77 | auVar98 & auVar96) ^ auVar80;
              auVar96 = packssdw(auVar80,auVar80);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._6_2_ >> 8 & 1) != 0) {
                puVar52[-0x1c] = 0xff;
              }
              auVar96 = (auVar94 | auVar34) ^ auVar114;
              auVar90._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar90._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar90._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar90._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar24._4_4_ = auVar90._0_4_;
              auVar24._0_4_ = auVar90._0_4_;
              auVar24._8_4_ = auVar90._8_4_;
              auVar24._12_4_ = auVar90._8_4_;
              auVar98 = pshuflw(auVar112,auVar24,0xe8);
              auVar81._0_4_ = -(uint)(auVar96._0_4_ == iVar67);
              auVar81._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
              auVar81._8_4_ = -(uint)(auVar96._8_4_ == iVar65);
              auVar81._12_4_ = -(uint)(auVar96._12_4_ == iVar61);
              auVar105._4_4_ = auVar81._4_4_;
              auVar105._0_4_ = auVar81._4_4_;
              auVar105._8_4_ = auVar81._12_4_;
              auVar105._12_4_ = auVar81._12_4_;
              auVar96 = pshuflw(auVar81,auVar105,0xe8);
              auVar106._4_4_ = auVar90._4_4_;
              auVar106._0_4_ = auVar90._4_4_;
              auVar106._8_4_ = auVar90._12_4_;
              auVar106._12_4_ = auVar90._12_4_;
              auVar77 = pshuflw(auVar90,auVar106,0xe8);
              auVar91._8_4_ = 0xffffffff;
              auVar91._0_8_ = 0xffffffffffffffff;
              auVar91._12_4_ = 0xffffffff;
              auVar91 = (auVar77 | auVar96 & auVar98) ^ auVar91;
              auVar77 = packssdw(auVar91,auVar91);
              auVar96 = packsswb(auVar96 & auVar98,auVar77);
              if ((auVar96 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar52[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar90._0_4_;
              auVar25._0_4_ = auVar90._0_4_;
              auVar25._8_4_ = auVar90._8_4_;
              auVar25._12_4_ = auVar90._8_4_;
              auVar106 = auVar105 & auVar25 | auVar106;
              auVar77 = packssdw(auVar106,auVar106);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar77 = packssdw(auVar77 ^ auVar13,auVar77 ^ auVar13);
              auVar96 = packsswb(auVar96,auVar77);
              if ((auVar96._8_2_ >> 8 & 1) != 0) {
                puVar52[-0x24] = 0xff;
              }
              auVar96 = (auVar94 | auVar33) ^ auVar114;
              auVar92._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar92._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar92._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar92._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar107._4_4_ = auVar92._0_4_;
              auVar107._0_4_ = auVar92._0_4_;
              auVar107._8_4_ = auVar92._8_4_;
              auVar107._12_4_ = auVar92._8_4_;
              iVar72 = -(uint)(auVar96._4_4_ == iVar64);
              iVar43 = -(uint)(auVar96._12_4_ == iVar61);
              auVar26._4_4_ = iVar72;
              auVar26._0_4_ = iVar72;
              auVar26._8_4_ = iVar43;
              auVar26._12_4_ = iVar43;
              auVar113._4_4_ = auVar92._4_4_;
              auVar113._0_4_ = auVar92._4_4_;
              auVar113._8_4_ = auVar92._12_4_;
              auVar113._12_4_ = auVar92._12_4_;
              auVar96 = auVar26 & auVar107 | auVar113;
              auVar96 = packssdw(auVar96,auVar96);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar14,auVar96 ^ auVar14);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar52[-0x28] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar107,0x84);
              auVar27._4_4_ = iVar72;
              auVar27._0_4_ = iVar72;
              auVar27._8_4_ = iVar43;
              auVar27._12_4_ = iVar43;
              auVar98 = pshufhw(auVar92,auVar27,0x84);
              auVar77 = pshufhw(auVar96,auVar113,0x84);
              auVar82._8_4_ = 0xffffffff;
              auVar82._0_8_ = 0xffffffffffffffff;
              auVar82._12_4_ = 0xffffffff;
              auVar82 = (auVar77 | auVar98 & auVar96) ^ auVar82;
              auVar96 = packssdw(auVar82,auVar82);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._10_2_ >> 8 & 1) != 0) {
                puVar52[-0x2c] = 0xff;
              }
              auVar96 = (auVar94 | _DAT_001af3d0) ^ auVar114;
              auVar93._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar93._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar93._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar93._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar28._4_4_ = auVar93._0_4_;
              auVar28._0_4_ = auVar93._0_4_;
              auVar28._8_4_ = auVar93._8_4_;
              auVar28._12_4_ = auVar93._8_4_;
              auVar98 = pshuflw(auVar113,auVar28,0xe8);
              auVar83._0_4_ = -(uint)(auVar96._0_4_ == iVar67);
              auVar83._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
              auVar83._8_4_ = -(uint)(auVar96._8_4_ == iVar65);
              auVar83._12_4_ = -(uint)(auVar96._12_4_ == iVar61);
              auVar108._4_4_ = auVar83._4_4_;
              auVar108._0_4_ = auVar83._4_4_;
              auVar108._8_4_ = auVar83._12_4_;
              auVar108._12_4_ = auVar83._12_4_;
              auVar96 = pshuflw(auVar83,auVar108,0xe8);
              auVar109._4_4_ = auVar93._4_4_;
              auVar109._0_4_ = auVar93._4_4_;
              auVar109._8_4_ = auVar93._12_4_;
              auVar109._12_4_ = auVar93._12_4_;
              auVar77 = pshuflw(auVar93,auVar109,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 & auVar98,(auVar77 | auVar96 & auVar98) ^ auVar15);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar93._0_4_;
              auVar29._0_4_ = auVar93._0_4_;
              auVar29._8_4_ = auVar93._8_4_;
              auVar29._12_4_ = auVar93._8_4_;
              auVar109 = auVar108 & auVar29 | auVar109;
              auVar77 = packssdw(auVar109,auVar109);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96,auVar77 ^ auVar16);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96._12_2_ >> 8 & 1) != 0) {
                puVar52[-0x34] = 0xff;
              }
              auVar96 = (auVar94 | _DAT_001af3c0) ^ auVar114;
              auVar84._0_4_ = -(uint)(iVar67 < auVar96._0_4_);
              auVar84._4_4_ = -(uint)(iVar64 < auVar96._4_4_);
              auVar84._8_4_ = -(uint)(iVar65 < auVar96._8_4_);
              auVar84._12_4_ = -(uint)(iVar61 < auVar96._12_4_);
              auVar110._4_4_ = auVar84._0_4_;
              auVar110._0_4_ = auVar84._0_4_;
              auVar110._8_4_ = auVar84._8_4_;
              auVar110._12_4_ = auVar84._8_4_;
              auVar95._4_4_ = -(uint)(auVar96._4_4_ == iVar64);
              auVar95._12_4_ = -(uint)(auVar96._12_4_ == iVar61);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar97._4_4_ = auVar84._4_4_;
              auVar97._0_4_ = auVar84._4_4_;
              auVar97._8_4_ = auVar84._12_4_;
              auVar97._12_4_ = auVar84._12_4_;
              auVar77 = auVar95 & auVar110 | auVar97;
              auVar96 = packssdw(auVar84,auVar77);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar96 = packssdw(auVar96 ^ auVar17,auVar96 ^ auVar17);
              auVar96 = packsswb(auVar96,auVar96);
              if ((auVar96 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x38] = 0xff;
              }
              auVar96 = pshufhw(auVar96,auVar110,0x84);
              in_XMM2 = pshufhw(auVar77,auVar95,0x84);
              in_XMM2 = in_XMM2 & auVar96;
              auVar96 = pshufhw(auVar96,auVar97,0x84);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar96 | in_XMM2) ^ auVar85;
              auVar96 = packssdw(auVar85,auVar85);
              in_XMM1 = packsswb(auVar96,auVar96);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar52[-0x3c] = 0xff;
              }
              uVar70 = uVar70 + 0x10;
              puVar52 = puVar52 + -0x40;
            } while ((uVar66 + 0x10 & 0x3ffffff0) != uVar70);
          }
          if ((int)local_88b0 < 1) {
            uVar73 = s->img_x;
          }
          else {
            uVar73 = s->img_x;
            if (0 < (int)sVar41 >> 1) {
              uVar66 = uVar73 * iVar40;
              uVar42 = (sVar41 - 1) * uVar66;
              uVar70 = 0;
              uVar71 = 0;
              do {
                if (0 < (int)uVar66) {
                  uVar68 = 0;
                  do {
                    uVar3 = data_00[uVar68 + uVar70];
                    data_00[uVar68 + uVar70] = data_00[uVar68 + uVar42];
                    data_00[uVar68 + uVar42] = uVar3;
                    uVar68 = uVar68 + 1;
                  } while (uVar66 != uVar68);
                }
                uVar71 = uVar71 + 1;
                uVar42 = uVar42 - uVar66;
                uVar70 = (ulong)((int)uVar70 + uVar66);
              } while (uVar71 != (uint)((int)sVar41 >> 1));
            }
          }
          if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_0014c1bb:
            *x = uVar73;
            *y = s->img_y;
            if (comp == (int *)0x0) {
              return data_00;
            }
            *comp = s->img_n;
            return data_00;
          }
          data_00 = stbi__convert_format(data_00,iVar40,req_comp,uVar73,sVar41);
          if (data_00 != (uchar *)0x0) {
            uVar73 = s->img_x;
            goto LAB_0014c1bb;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar53 = s->buffer_start;
        iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar53,s->buflen);
        if (iVar40 == 0) {
          s->read_from_callbacks = 0;
          psVar59 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar59 = psVar53 + iVar40;
          sVar38 = *psVar53;
        }
        s->img_buffer_end = psVar59;
        psVar48 = s->buffer_start + 1;
        s->img_buffer = psVar48;
        goto LAB_00149e79;
      }
LAB_0014a05d:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0014a06d:
      iVar40 = stbi__gif_test(s);
      if (iVar40 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar47 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar60);
        psVar51 = (stbi__context *)0x0;
        if (psVar47 != (stbi__context *)0x0 && psVar47 != s) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar51 = psVar47;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar51 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar47,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar44 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0014a579;
      }
      iVar40 = stbi__psd_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar49;
      }
      iVar40 = stbi__pic_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar40 = stbi__pnm_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar40 = stbi__hdr_test(s);
      if (iVar40 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar60 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar60;
      }
      iVar40 = stbi__tga_test(s);
      if (iVar40 != 0) {
        pvVar49 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_00148842:
    psVar51 = (stbi__context *)0x0;
  }
  return psVar51;
LAB_00149c3e:
  bVar75 = false;
LAB_00149c40:
  if (!bVar75) goto LAB_0014a55f;
LAB_00149c4d:
  bVar39 = psVar44->marker;
LAB_00149c58:
  if (bVar39 == 0xff) {
LAB_00149c65:
    do {
      psVar51 = psVar44->s;
      if ((psVar51->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00149c84:
        if (psVar51->img_buffer_end <= psVar51->img_buffer) goto LAB_00148937;
      }
      else {
        iVar40 = (*(psVar51->io).eof)(psVar51->io_user_data);
        if (iVar40 != 0) {
          if (psVar51->read_from_callbacks != 0) goto LAB_00149c84;
          goto LAB_00148937;
        }
      }
      psVar51 = psVar44->s;
      psVar60 = psVar51->img_buffer;
      if (psVar60 < psVar51->img_buffer_end) {
        psVar51->img_buffer = psVar60 + 1;
        sVar38 = *psVar60;
      }
      else {
        if (psVar51->read_from_callbacks == 0) goto LAB_00149c65;
        psVar60 = psVar51->buffer_start;
        iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
        if (iVar40 == 0) {
          psVar51->read_from_callbacks = 0;
          psVar59 = psVar51->buffer_start + 1;
          psVar51->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar59 = psVar60 + iVar40;
          sVar38 = *psVar60;
        }
        psVar51->img_buffer_end = psVar59;
        psVar51->img_buffer = psVar51->buffer_start + 1;
      }
    } while (sVar38 != 0xff);
    psVar51 = psVar44->s;
    psVar60 = psVar51->img_buffer;
    if (psVar60 < psVar51->img_buffer_end) {
      psVar51->img_buffer = psVar60 + 1;
      sVar38 = *psVar60;
    }
    else if (psVar51->read_from_callbacks == 0) {
      sVar38 = '\0';
    }
    else {
      psVar60 = psVar51->buffer_start;
      iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar60,psVar51->buflen);
      if (iVar40 == 0) {
        psVar51->read_from_callbacks = 0;
        psVar59 = psVar51->buffer_start + 1;
        psVar51->buffer_start[0] = '\0';
        sVar38 = '\0';
      }
      else {
        psVar59 = psVar60 + iVar40;
        sVar38 = *psVar60;
      }
      psVar51->img_buffer_end = psVar59;
      psVar51->img_buffer = psVar51->buffer_start + 1;
    }
    psVar44->marker = sVar38;
  }
LAB_00148937:
  bVar39 = stbi__get_marker(psVar44);
  goto LAB_001488e1;
LAB_0014bba9:
  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar66 - 0x10);
  psVar44->code_bits = uVar66 - 0x10;
LAB_0014bbb3:
  stbi__g_failure_reason = "bad huffman code";
LAB_0014a558:
  uVar73 = (uint)paVar57;
  goto LAB_0014a55f;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}